

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

GeluLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_gelu(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  GeluLayerParams *pGVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_gelu(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_gelu(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pGVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::GeluLayerParams>(arena);
    (this->layer_).gelu_ = pGVar2;
  }
  return (GeluLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GeluLayerParams* NeuralNetworkLayer::_internal_mutable_gelu() {
  if (!_internal_has_gelu()) {
    clear_layer();
    set_has_gelu();
    layer_.gelu_ = CreateMaybeMessage< ::CoreML::Specification::GeluLayerParams >(GetArenaForAllocation());
  }
  return layer_.gelu_;
}